

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.hpp
# Opt level: O0

void __thiscall
soplex::
Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::validateSolveReal(Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *soplex)

{
  bool bVar1;
  type_conflict5 tVar2;
  byte bVar3;
  Status SVar4;
  _Setprecision _Var5;
  char *__nptr;
  element_type *peVar6;
  undefined1 *puVar7;
  ostream *poVar8;
  ostream *r;
  ostream *poVar9;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  long in_RDI;
  ostream *os;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sol;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumDualViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumRedCostViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumRowViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumBoundViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxDualViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRedCostViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRowViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxBoundViolation;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  objViolation;
  string reason;
  bool passedValidation;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffee88;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffee90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee98;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffeea0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffeec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeed0;
  char *in_stack_ffffffffffffeed8;
  double in_stack_ffffffffffffef00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffef08;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffef10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffef18;
  ostream *in_stack_ffffffffffffef20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffef90;
  undefined6 in_stack_ffffffffffffef98;
  undefined1 in_stack_ffffffffffffef9e;
  undefined1 in_stack_ffffffffffffef9f;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffefa0;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffefa8;
  type_conflict5 local_102b;
  type_conflict5 local_1029;
  string local_ff8 [32];
  string local_fd8 [48];
  undefined1 local_fa8 [96];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff0b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff0c0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff0c8;
  undefined1 local_f28 [80];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff128;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff130;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff138;
  undefined1 local_e98 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff1e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff1f0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff1f8;
  undefined1 local_d88 [128];
  undefined1 local_d08 [144];
  undefined1 local_c78 [128];
  undefined1 local_bf8 [128];
  undefined1 local_b78 [128];
  undefined8 local_af8;
  undefined1 local_af0 [128];
  undefined1 local_a70 [128];
  undefined8 local_9f0;
  Real local_9e8;
  Real local_9e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9d8;
  undefined1 local_958 [128];
  undefined1 local_8d8 [128];
  double local_858;
  Real local_850;
  Real local_848;
  Verbosity local_83c;
  ostream *local_838;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_830;
  undefined8 local_7b0;
  undefined1 local_7a8 [128];
  undefined8 local_728;
  undefined1 local_720 [128];
  undefined8 local_6a0;
  undefined1 local_698 [128];
  undefined8 local_618;
  undefined1 local_610 [128];
  undefined8 local_590;
  undefined1 local_588 [128];
  undefined8 local_508;
  undefined1 local_500 [128];
  undefined8 local_480;
  undefined1 local_478 [128];
  undefined8 local_3f8;
  undefined1 local_3f0 [128];
  undefined8 local_370;
  undefined1 local_364 [147];
  allocator local_2d1;
  string local_2d0 [39];
  byte local_2a9;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2a8;
  undefined8 local_298;
  undefined8 *local_290;
  undefined1 *local_288;
  undefined8 local_280;
  undefined8 *local_278;
  undefined1 *local_270;
  undefined8 local_268;
  undefined8 *local_260;
  undefined1 *local_258;
  undefined8 local_250;
  undefined8 *local_248;
  undefined1 *local_240;
  undefined8 local_238;
  undefined8 *local_230;
  undefined1 *local_228;
  undefined8 local_220;
  undefined8 *local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined8 *local_200;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined8 *local_1e8;
  undefined1 *local_1e0;
  undefined8 local_1d8;
  undefined8 *local_1d0;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined8 *local_1b8;
  undefined1 *local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  long local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  long local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  long local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  long local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  long local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined8 *local_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  undefined1 *local_98;
  undefined8 *local_90;
  double *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  double *local_78;
  Real *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  Real *local_60;
  Real *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  Real *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_2a9 = 1;
  local_2a8 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"",&local_2d1);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  local_370 = 0;
  local_288 = local_364;
  local_290 = &local_370;
  local_298 = 0;
  local_a8 = local_290;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffeea0,(double)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90);
  local_3f8 = 0;
  local_270 = local_3f0;
  local_278 = &local_3f8;
  local_280 = 0;
  local_b0 = local_278;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffeea0,(double)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90);
  local_480 = 0;
  local_258 = local_478;
  local_260 = &local_480;
  local_268 = 0;
  local_b8 = local_260;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffeea0,(double)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90);
  local_508 = 0;
  local_240 = local_500;
  local_248 = &local_508;
  local_250 = 0;
  local_c0 = local_248;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffeea0,(double)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90);
  local_590 = 0;
  local_228 = local_588;
  local_230 = &local_590;
  local_238 = 0;
  local_c8 = local_230;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffeea0,(double)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90);
  local_618 = 0;
  local_210 = local_610;
  local_218 = &local_618;
  local_220 = 0;
  local_d0 = local_218;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffeea0,(double)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90);
  local_6a0 = 0;
  local_1f8 = local_698;
  local_200 = &local_6a0;
  local_208 = 0;
  local_d8 = local_200;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffeea0,(double)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90);
  local_728 = 0;
  local_1e0 = local_720;
  local_1e8 = &local_728;
  local_1f0 = 0;
  local_e0 = local_1e8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffeea0,(double)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90);
  local_7b0 = 0;
  local_1c8 = local_7a8;
  local_1d0 = &local_7b0;
  local_1d8 = 0;
  local_e8 = local_1d0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffeea0,(double)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90);
  local_1a8 = &local_830;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffee90);
  local_83c = INFO1;
  local_838 = SPxOut::getStream(&local_2a8->spxout,&local_83c);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffee90,(char *)in_stack_ffffffffffffee88);
  if (bVar1) {
    local_848 = SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::realParam(local_2a8,INFTY);
    local_50 = &local_830;
    local_58 = &local_848;
    local_48 = local_58;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              (in_stack_ffffffffffffefa8,(double)in_stack_ffffffffffffefa0);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffee90,(char *)in_stack_ffffffffffffee88);
    if (bVar1) {
      local_850 = SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::realParam(local_2a8,INFTY);
      local_850 = -local_850;
      local_68 = &local_830;
      local_70 = &local_850;
      local_60 = local_70;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                (in_stack_ffffffffffffefa8,(double)in_stack_ffffffffffffefa0);
    }
    else {
      __nptr = (char *)std::__cxx11::string::c_str();
      local_858 = atof(__nptr);
      local_80 = &local_830;
      local_88 = &local_858;
      local_78 = local_88;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                (in_stack_ffffffffffffefa8,(double)in_stack_ffffffffffffefa0);
    }
  }
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::objValueReal(in_stack_ffffffffffffeec8);
  local_30 = &local_830;
  local_38 = &local_9d8;
  local_28 = local_958;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_39,local_30,local_38);
  local_20 = local_958;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffee90);
  local_10 = local_30;
  local_18 = local_38;
  local_8 = local_958;
  boost::multiprecision::default_ops::
  eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (in_stack_ffffffffffffee90,(cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffee88,
             (cpp_dec_float<200U,_int,_void> *)0x6460f2);
  spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)in_stack_ffffffffffffee88);
  local_f8 = local_364;
  local_100 = local_8d8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_stack_ffffffffffffee90,(cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffee88);
  SVar4 = SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::status(local_2a8);
  local_1029 = false;
  if (SVar4 == INForUNBD) {
    local_9e0 = SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::realParam(local_2a8,INFTY);
    tVar2 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffee88,(double *)0x646197);
    local_102b = true;
    if (!tVar2) {
      local_9e8 = SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::realParam(local_2a8,INFTY);
      local_9e8 = -local_9e8;
      local_102b = boost::multiprecision::operator==
                             ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)in_stack_ffffffffffffee88,(double *)0x6461f2);
    }
    local_1029 = local_102b;
  }
  if (local_1029 != false) {
    local_9f0 = 0;
    local_98 = local_364;
    local_a0 = &local_9f0;
    local_90 = local_a0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              (in_stack_ffffffffffffefa8,(double)in_stack_ffffffffffffefa0);
  }
  local_198 = local_a70;
  local_1a0 = local_364;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffee90,(cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffee88);
  local_af8 = 0;
  local_1b0 = local_af0;
  local_1b8 = &local_af8;
  local_1c0 = 0;
  local_f0 = local_1b8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffeea0,(double)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90);
  local_190 = in_RDI + 0x28;
  local_188 = local_b78;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffee90,(cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffee88);
  bVar1 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (in_stack_ffffffffffffefa0,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT17(in_stack_ffffffffffffef9f,
                                 CONCAT16(in_stack_ffffffffffffef9e,in_stack_ffffffffffffef98)),
                     in_stack_ffffffffffffef90);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_2a9 = 0;
    std::__cxx11::string::operator+=(local_2d0,"Objective Violation; ");
  }
  SVar4 = SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::status(local_2a8);
  if (SVar4 == OPTIMAL) {
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getBoundViolation(in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
                        in_stack_fffffffffffff0b8);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getRowViolation(in_stack_fffffffffffff138,in_stack_fffffffffffff130,in_stack_fffffffffffff128)
    ;
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getRedCostViolation
              (in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getDualViolation(in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8
                      );
    local_178 = local_bf8;
    local_180 = local_3f0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffee90,(cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffee88
              );
    local_170 = in_RDI + 0x28;
    local_168 = local_c78;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffee90,(cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffee88
              );
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances(in_stack_ffffffffffffee88);
    peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x6464e5);
    Tolerances::epsilon(peVar6);
    bVar1 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (in_stack_ffffffffffffef10,in_stack_ffffffffffffef08,in_stack_ffffffffffffef00
                      );
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x64653c);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_2a9 = 0;
      std::__cxx11::string::operator+=(local_2d0,"Bound Violation; ");
    }
    local_158 = local_d08;
    local_160 = local_478;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffee90,(cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffee88
              );
    local_150 = in_RDI + 0x28;
    local_148 = local_d88;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffee90,(cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffee88
              );
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances(in_stack_ffffffffffffee88);
    peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x646627);
    Tolerances::epsilon(peVar6);
    bVar1 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (in_stack_ffffffffffffef10,in_stack_ffffffffffffef08,in_stack_ffffffffffffef00
                      );
    bVar3 = bVar1 ^ 0xff;
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x64667e);
    if ((bVar3 & 1) != 0) {
      local_2a9 = 0;
      std::__cxx11::string::operator+=(local_2d0,"Row Violation; ");
    }
    local_138 = &stack0xfffffffffffff1e8;
    local_140 = local_500;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffee90,(cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffee88
              );
    local_130 = in_RDI + 0x28;
    local_128 = local_e98;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffee90,(cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffee88
              );
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances(in_stack_ffffffffffffee88);
    peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x646769);
    Tolerances::epsilon(peVar6);
    bVar1 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (in_stack_ffffffffffffef10,in_stack_ffffffffffffef08,in_stack_ffffffffffffef00
                      );
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x6467c0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_2a9 = 0;
      std::__cxx11::string::operator+=(local_2d0,"Reduced Cost Violation; ");
    }
    local_118 = local_f28;
    local_120 = local_588;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffee90,(cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffee88
              );
    local_110 = in_RDI + 0x28;
    local_108 = local_fa8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffee90,(cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffee88
              );
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances(in_stack_ffffffffffffee88);
    peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x6468ab);
    Tolerances::epsilon(peVar6);
    bVar1 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (in_stack_ffffffffffffef10,in_stack_ffffffffffffef08,in_stack_ffffffffffffef00
                      );
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x646902);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_2a9 = 0;
      std::__cxx11::string::operator+=(local_2d0,"Dual Violation; ");
    }
  }
  std::operator<<(local_838,"\n");
  std::operator<<(local_838,"Validation          :");
  if ((local_2a9 & 1) == 0) {
    std::__cxx11::string::length();
    puVar7 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_2d0);
    poVar8 = local_838;
    *puVar7 = 0x5d;
    std::operator+(in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0);
    std::operator+(in_stack_ffffffffffffee98,(char *)in_stack_ffffffffffffee90);
    std::operator<<(poVar8,local_fd8);
    std::__cxx11::string::~string(local_fd8);
    std::__cxx11::string::~string(local_ff8);
  }
  else {
    std::operator<<(local_838," Success\n");
  }
  poVar8 = std::operator<<(local_838,"   Objective        : ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::scientific);
  _Var5 = std::setprecision(8);
  std::operator<<(poVar8,_Var5);
  poVar8 = boost::multiprecision::operator<<(in_stack_ffffffffffffef20,in_stack_ffffffffffffef18);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::fixed);
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(local_838,"   Bound            : ");
  r = (ostream *)std::ostream::operator<<(poVar8,std::scientific);
  _Var5 = std::setprecision(8);
  std::operator<<(r,_Var5);
  poVar9 = boost::multiprecision::operator<<
                     (poVar8,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)r);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::fixed);
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<(local_838,"   Row              : ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::scientific);
  _Var5 = std::setprecision(8);
  std::operator<<(poVar9,_Var5);
  poVar9 = boost::multiprecision::operator<<
                     (poVar8,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)r);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::fixed);
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<(local_838,"   Reduced Cost     : ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::scientific);
  _Var5 = std::setprecision(8);
  std::operator<<(poVar9,_Var5);
  poVar9 = boost::multiprecision::operator<<
                     (poVar8,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)r);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::fixed);
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<(local_838,"   Dual             : ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::scientific);
  _Var5 = std::setprecision(8);
  std::operator<<(poVar9,_Var5);
  poVar8 = boost::multiprecision::operator<<
                     (poVar8,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)r);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::fixed);
  std::operator<<(poVar8,"\n");
  std::__cxx11::string::~string(local_2d0);
  return;
}

Assistant:

void Validation<R>::validateSolveReal(SoPlexBase<R>& soplex)
{
   bool passedValidation = true;
   std::string reason = "";
   R objViolation = 0.0;
   R maxBoundViolation = 0.0;
   R maxRowViolation = 0.0;
   R maxRedCostViolation = 0.0;
   R maxDualViolation = 0.0;
   R sumBoundViolation = 0.0;
   R sumRowViolation = 0.0;
   R sumRedCostViolation = 0.0;
   R sumDualViolation = 0.0;
   R sol;

   std::ostream& os = soplex.spxout.getStream(SPxOut::INFO1);

   if(validatesolution == "+infinity")
   {
      sol = soplex.realParam(SoPlexBase<R>::INFTY);
   }
   else if(validatesolution == "-infinity")
   {
      sol = -soplex.realParam(SoPlexBase<R>::INFTY);
   }
   else
   {
      sol = atof(validatesolution.c_str());
   }

   objViolation = spxAbs(sol - soplex.objValueReal());

   // skip check in case presolving detected infeasibility/unboundedness
   if(SPxSolverBase<R>::INForUNBD == soplex.status() &&
         (sol == soplex.realParam(SoPlexBase<R>::INFTY)
          || sol == -soplex.realParam(SoPlexBase<R>::INFTY)))
      objViolation = 0.0;

   if(! EQ(objViolation, R(0.0), validatetolerance))
   {
      passedValidation = false;
      reason += "Objective Violation; ";
   }

   if(SPxSolverBase<R>::OPTIMAL == soplex.status())
   {
      soplex.getBoundViolation(maxBoundViolation, sumBoundViolation);
      soplex.getRowViolation(maxRowViolation, sumRowViolation);
      soplex.getRedCostViolation(maxRedCostViolation, sumRedCostViolation);
      soplex.getDualViolation(maxDualViolation, sumDualViolation);

      if(! LE(maxBoundViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Bound Violation; ";
      }

      if(! LE(maxRowViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Row Violation; ";
      }

      if(! LE(maxRedCostViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Reduced Cost Violation; ";
      }

      if(! LE(maxDualViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Dual Violation; ";
      }
   }

   os << "\n";
   os << "Validation          :";

   if(passedValidation)
      os << " Success\n";
   else
   {
      reason[reason.length() - 2] = ']';
      os << " Fail [" + reason + "\n";
   }

   os << "   Objective        : " << std::scientific << std::setprecision(
         8) << objViolation << std::fixed << "\n";
   os << "   Bound            : " << std::scientific << std::setprecision(
         8) << maxBoundViolation << std::fixed << "\n";
   os << "   Row              : " << std::scientific << std::setprecision(
         8) << maxRowViolation << std::fixed << "\n";
   os << "   Reduced Cost     : " << std::scientific << std::setprecision(
         8) << maxRedCostViolation << std::fixed << "\n";
   os << "   Dual             : " << std::scientific << std::setprecision(
         8) << maxDualViolation << std::fixed << "\n";
}